

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/linux/test_linux_epoll.c"
            );
  UnityDefaultTestRun(test_create_loop,"test_create_loop",0x38d);
  UnityDefaultTestRun(test_createloop_epoll_create1_fails,"test_createloop_epoll_create1_fails",
                      0x38e);
  UnityDefaultTestRun(test_createloop_epoll_eventfd_fails,"test_createloop_epoll_eventfd_fails",
                      0x38f);
  UnityDefaultTestRun(test_createloop_epoll_eventloop_add_fails,
                      "test_createloop_epoll_eventloop_add_fails",0x390);
  UnityDefaultTestRun(test_createloop_epoll_eventloop_register_read_fails,
                      "test_createloop_epoll_eventloop_register_read_fails",0x391);
  UnityDefaultTestRun(test_add_event,"test_add_event",0x392);
  UnityDefaultTestRun(test_add_event_fails,"test_add_event_fails",0x393);
  UnityDefaultTestRun(test_cancel,"test_cancel",0x394);
  UnityDefaultTestRun(test_register_event_fails,"test_register_event_fails",0x395);
  UnityDefaultTestRun(test_notify_event,"test_notify_event",0x396);
  UnityDefaultTestRun(test_notify_error_event,"test_notify_error_event",0x397);
  UnityDefaultTestRun(test_notify_hup_event,"test_notify_hup_event",0x398);
  UnityDefaultTestRun(test_notify_three_event_and_remove,"test_notify_three_event_and_remove",0x399)
  ;
  UnityDefaultTestRun(test_notify_single_fd_multiple_events,"test_notify_single_fd_multiple_events",
                      0x39a);
  UnityDefaultTestRun(test_notify_single_fd_multiple_events_remove_from_loop,
                      "test_notify_single_fd_multiple_events_remove_from_loop",0x39b);
  UnityDefaultTestRun(test_notify_single_fd_multiple_events_unregister_write_event,
                      "test_notify_single_fd_multiple_events_unregister_write_event",0x39c);
  UnityDefaultTestRun(test_notify_two_fds_unregister_read,"test_notify_two_fds_unregister_read",
                      0x39d);
  UnityDefaultTestRun(test_epoll_wait_interrupted,"test_epoll_wait_interrupted",0x39e);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_create_loop);
	RUN_TEST(test_createloop_epoll_create1_fails);
	RUN_TEST(test_createloop_epoll_eventfd_fails);
	RUN_TEST(test_createloop_epoll_eventloop_add_fails);
	RUN_TEST(test_createloop_epoll_eventloop_register_read_fails);
	RUN_TEST(test_add_event);
	RUN_TEST(test_add_event_fails);
	RUN_TEST(test_cancel);
	RUN_TEST(test_register_event_fails);
	RUN_TEST(test_notify_event);
	RUN_TEST(test_notify_error_event);
	RUN_TEST(test_notify_hup_event);
	RUN_TEST(test_notify_three_event_and_remove);
	RUN_TEST(test_notify_single_fd_multiple_events);
	RUN_TEST(test_notify_single_fd_multiple_events_remove_from_loop);
	RUN_TEST(test_notify_single_fd_multiple_events_unregister_write_event);
	RUN_TEST(test_notify_two_fds_unregister_read);
	RUN_TEST(test_epoll_wait_interrupted);
	return UNITY_END();
}